

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb_test_helper.c
# Opt level: O3

MMDB_lookup_result_s *
lookup_sockaddr_ok(MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,char *ip,char *file,
                  char *mode_desc)

{
  int gai_error;
  int mmdb_error;
  addrinfo *addresses;
  int local_6c;
  addrinfo *local_68;
  addrinfo local_60;
  
  local_60.ai_addrlen = 0;
  local_60._20_4_ = 0;
  local_60.ai_next = (addrinfo *)0x0;
  local_60.ai_addr = (sockaddr *)0x0;
  local_60.ai_canonname = (char *)0x0;
  local_60.ai_socktype = 1;
  local_60.ai_protocol = 0;
  local_68 = (addrinfo *)0x0;
  local_60.ai_flags = (uint)(*ip == ':') * 8 + 4;
  local_60.ai_family = (uint)(*ip == ':') * 8 + 2;
  gai_error = getaddrinfo(ip,(char *)0x0,&local_60,&local_68);
  local_6c = 0;
  *(undefined8 *)&(__return_storage_ptr__->entry).offset = 0;
  *(undefined8 *)&__return_storage_ptr__->netmask = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->entry).mmdb = (MMDB_s *)0x0;
  if (gai_error == 0) {
    MMDB_lookup_sockaddr(__return_storage_ptr__,mmdb,(sockaddr *)local_68->ai_addr,&local_6c);
  }
  if (local_68 != (addrinfo *)0x0) {
    freeaddrinfo(local_68);
  }
  test_lookup_errors(gai_error,local_6c,"MMDB_lookup_sockaddr",ip,file,mode_desc);
  return __return_storage_ptr__;
}

Assistant:

MMDB_lookup_result_s lookup_sockaddr_ok(MMDB_s *mmdb,
                                        const char *ip,
                                        const char *file,
                                        const char *mode_desc) {
    int ai_flags = AI_NUMERICHOST;
    struct addrinfo hints = {.ai_socktype = SOCK_STREAM};
    struct addrinfo *addresses = NULL;

    if (ip[0] == ':') {
        hints.ai_flags = ai_flags;
#if defined AI_V4MAPPED && !defined __FreeBSD__
        hints.ai_flags |= AI_V4MAPPED;
#endif
        hints.ai_family = AF_INET6;
    } else {
        hints.ai_flags = ai_flags;
        hints.ai_family = AF_INET;
    }

    int gai_error = getaddrinfo(ip, NULL, &hints, &addresses);

    int mmdb_error = 0;
    MMDB_lookup_result_s result = {.found_entry = false};
    if (gai_error == 0) {
        result = MMDB_lookup_sockaddr(mmdb, addresses->ai_addr, &mmdb_error);
    }
    if (NULL != addresses) {
        freeaddrinfo(addresses);
    }

    test_lookup_errors(
        gai_error, mmdb_error, "MMDB_lookup_sockaddr", ip, file, mode_desc);

    return result;
}